

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O3

int bconchar(bstring b,char c)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  
  iVar3 = -1;
  if (b != (bstring)0x0) {
    uVar1 = b->slen;
    if (-1 < (int)(b->mlen - uVar1 | uVar1)) {
      iVar2 = balloc(b,uVar1 + 2);
      if (iVar2 == 0) {
        b->data[(int)uVar1] = c;
        b->data[(long)(int)uVar1 + 1] = '\0';
        b->slen = b->slen + 1;
        iVar3 = 0;
      }
    }
  }
  return iVar3;
}

Assistant:

int bconchar (bstring b, char c) {
int d;

	if (b == NULL) return BSTR_ERR;
	d = b->slen;
	if ((d | (b->mlen - d)) < 0 || balloc (b, d + 2) != BSTR_OK) return BSTR_ERR;
	b->data[d] = (unsigned char) c;
	b->data[d + 1] = (unsigned char) '\0';
	b->slen++;
	return 0;
}